

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

void __thiscall Population::applyMutation(Population *this)

{
  int iVar1;
  
  CompoundMutation::getMutation(&this->mutationTree);
  iVar1 = (this->mutationTree).super_MutationComponent.productivity;
  this->health = (((this->mutationTree).super_MutationComponent.health + 100) * this->health) / 100;
  this->productivity = ((iVar1 + 100) * this->productivity) / 100;
  switchParam(&this->size,(this->mutationTree).super_MutationComponent.size);
  switchParam(&this->safety,(this->mutationTree).super_MutationComponent.safety);
  switchParam(&this->velocity,(this->mutationTree).super_MutationComponent.velocity);
  switchParam(&this->cover,(this->mutationTree).super_MutationComponent.cover);
  return;
}

Assistant:

void Population::applyMutation() {
  mutationTree.getMutation();
  health *= (100 + mutationTree.health);
  productivity *= (100 + mutationTree.productivity);
  health /= 100;
  productivity /= 100;
  switchParam(size, mutationTree.size);
  switchParam(safety, mutationTree.safety);
  switchParam(velocity, mutationTree.velocity);
  switchParam(cover, mutationTree.cover);
}